

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O1

string * kratos::fields_to_json
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *vars)

{
  _Base_ptr p_Var1;
  undefined8 extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Rb_tree_header *p_Var2;
  _Rb_tree_node_base *p_Var3;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 auVar4 [16];
  undefined1 auStack_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  string local_a8;
  string local_88;
  undefined1 auStack_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  auStack_c8 = (undefined1  [8])0x0;
  entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_c8,(vars->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = p_Var1;
  p_Var2 = &(vars->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      p_Var3 = auVar4._0_8_;
      full_path_abi_cxx11_(&local_88,*(kratos **)(p_Var3 + 2),auVar4._8_8_);
      auStack_68 = *(undefined1 (*) [8])(p_Var3 + 1);
      content._M_dataplus._M_p = (pointer)p_Var3[1]._M_parent;
      content._M_string_length = (size_type)local_88._M_dataplus._M_p;
      content.field_2._M_allocated_capacity = local_88._M_string_length;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0xc;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_a8,(detail *)"\"{0}\": \"{1}\"",format_str,args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_c8,
                 &local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      auVar4 = std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)auVar4._0_8_ != p_Var2);
  }
  local_88._M_dataplus._M_p = (pointer)&local_a8;
  local_a8._M_dataplus._M_p = (pointer)auStack_c8;
  local_a8._M_string_length =
       (size_type)
       entries.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.field_2._M_allocated_capacity = (long)": must be in range [0, " + 0x15;
  local_a8.field_2._8_8_ = 2;
  local_88._M_string_length =
       (size_type)
       fmt::v7::detail::
       value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
       format_custom_arg<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v7::formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
  ;
  format_str_00.size_ = 0xf;
  format_str_00.data_ = (char *)0x3;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_68,(detail *)0x23f6ee,format_str_00,args_00)
  ;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)auStack_68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (auStack_68 != (undefined1  [8])&content._M_string_length) {
    operator_delete((void *)auStack_68,content._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string fields_to_json(const std::map<std::string, std::shared_ptr<Var>> &vars) {
    // layman's json serializer
    std::string result = "{";
    std::vector<std::string> entries;
    entries.reserve(vars.size());
    for (auto const &[name, var] : vars) {
        entries.emplace_back(fmt::format(R"("{0}": "{1}")", name, full_path(var.get())));
    }
    auto content = fmt::format("{0}", fmt::join(entries.begin(), entries.end(), ", "));
    result.append(content);
    result.append("}");
    return result;
}